

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void itranspose(double *A,int M,int N)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  
  uVar8 = (ulong)(uint)M;
  uVar2 = M - N;
  if (uVar2 == 0) {
    if (0 < M) {
      pdVar3 = A + uVar8;
      pdVar4 = A + 1;
      uVar9 = 0;
      uVar7 = uVar8;
      do {
        uVar7 = uVar7 - 1;
        uVar9 = uVar9 + 1;
        if (uVar9 < uVar8) {
          uVar11 = 0;
          pdVar6 = pdVar3;
          do {
            dVar1 = *pdVar6;
            *pdVar6 = pdVar4[uVar11];
            pdVar4[uVar11] = dVar1;
            uVar11 = uVar11 + 1;
            pdVar6 = pdVar6 + uVar8;
          } while (uVar7 != uVar11);
        }
        pdVar4 = pdVar4 + uVar8 + 1;
        pdVar3 = pdVar3 + uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    return;
  }
  if (uVar2 == 0 || M < N) {
    if (N <= M) {
      return;
    }
    uVar2 = N - M;
    lVar13 = (long)M;
    sVar14 = (int)uVar2 * lVar13 * 8;
    pdVar3 = (double *)malloc(sVar14);
    if (0 < M) {
      pdVar4 = A + lVar13;
      uVar7 = 0;
      pdVar6 = pdVar3;
      do {
        if (0 < (int)uVar2) {
          uVar9 = 0;
          pdVar10 = pdVar6;
          do {
            *pdVar10 = pdVar4[uVar9];
            uVar9 = uVar9 + 1;
            pdVar10 = pdVar10 + lVar13;
          } while (uVar2 != uVar9);
        }
        uVar7 = uVar7 + 1;
        pdVar4 = pdVar4 + N;
        pdVar6 = pdVar6 + 1;
      } while (uVar7 != uVar8);
      if (M != 1) {
        pdVar4 = A + N;
        pdVar6 = A + lVar13;
        lVar12 = uVar8 - 1;
        do {
          memmove(pdVar6,pdVar4,lVar13 * 8);
          pdVar4 = pdVar4 + N;
          pdVar6 = pdVar6 + lVar13;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      if (0 < M) {
        pdVar4 = A + 1;
        pdVar6 = A + uVar8;
        uVar9 = 0;
        uVar7 = uVar8;
        do {
          uVar7 = uVar7 - 1;
          uVar9 = uVar9 + 1;
          if ((long)uVar9 < lVar13) {
            uVar11 = 0;
            pdVar10 = pdVar6;
            do {
              dVar1 = *pdVar10;
              *pdVar10 = pdVar4[uVar11];
              pdVar4[uVar11] = dVar1;
              uVar11 = uVar11 + 1;
              pdVar10 = pdVar10 + uVar8;
            } while (uVar7 != uVar11);
          }
          pdVar4 = pdVar4 + uVar8 + 1;
          pdVar6 = pdVar6 + uVar8 + 1;
        } while (uVar9 != uVar8);
      }
    }
    memcpy(A + (uint)(M * M),pdVar3,sVar14);
  }
  else {
    lVar13 = (long)N;
    sVar14 = (int)uVar2 * lVar13 * 8;
    pdVar3 = (double *)malloc(sVar14);
    memcpy(pdVar3,A + (uint)(N * N),sVar14);
    if (0 < N) {
      uVar9 = (ulong)(uint)N;
      pdVar4 = A + 1;
      pdVar6 = A + uVar9;
      uVar7 = 0;
      uVar8 = uVar9;
      do {
        uVar8 = uVar8 - 1;
        uVar7 = uVar7 + 1;
        if ((long)uVar7 < lVar13) {
          uVar11 = 0;
          pdVar10 = pdVar6;
          do {
            dVar1 = *pdVar10;
            *pdVar10 = pdVar4[uVar11];
            pdVar4[uVar11] = dVar1;
            uVar11 = uVar11 + 1;
            pdVar10 = pdVar10 + uVar9;
          } while (uVar8 != uVar11);
        }
        pdVar4 = pdVar4 + uVar9 + 1;
        pdVar6 = pdVar6 + uVar9 + 1;
      } while (uVar7 != uVar9);
      if (N != 1) {
        lVar5 = (long)M;
        lVar12 = lVar13 + 1;
        pdVar4 = A + (lVar13 + -1) * lVar13;
        pdVar6 = A + (lVar13 + -1) * lVar5;
        do {
          memmove(pdVar6,pdVar4,lVar5 * 8);
          lVar12 = lVar12 + -1;
          pdVar4 = pdVar4 + -lVar13;
          pdVar6 = pdVar6 + -lVar5;
        } while (2 < lVar12);
      }
      if (0 < N) {
        pdVar4 = A + lVar13;
        uVar8 = 0;
        pdVar6 = pdVar3;
        do {
          if (0 < (int)uVar2) {
            uVar7 = 0;
            pdVar10 = pdVar6;
            do {
              pdVar4[uVar7] = *pdVar10;
              uVar7 = uVar7 + 1;
              pdVar10 = pdVar10 + lVar13;
            } while (uVar2 != uVar7);
          }
          uVar8 = uVar8 + 1;
          pdVar4 = pdVar4 + M;
          pdVar6 = pdVar6 + 1;
        } while (uVar8 != uVar9);
      }
    }
  }
  free(pdVar3);
  return;
}

Assistant:

void itranspose(double *A, int M, int N) {
	int i, j, p, iter;
	double *buf;
	double temp;

	if (M == N) {
		for (i = 0; i < N; ++i) {
			for (j = i + 1; j < N; ++j) {
				temp = A[i + j*N];
				A[i + j*N] = A[j + i*N];
				A[j + i*N] = temp;
			}
		}
	} else if (M > N) {

		p = M - N;
		buf = (double*)malloc(sizeof(double)* p * N);

		memcpy(buf, A + N * N, sizeof(*A)*p*N);

		for (i = 0; i < N; ++i) {
			for (j = i + 1; j < N; ++j) {
				temp = A[i + j*N];
				A[i + j*N] = A[j + i*N];
				A[j + i*N] = temp;
			}
		}

		for (i = N - 1; i >= 1; --i) {
			memmove(A + i*M, A + i*N, sizeof(*A)*M);
		}


		for (i = 0; i < N; ++i) {
			iter = N + i * M;
			for (j = 0; j < p; ++j) {
				A[iter + j] = buf[j*N + i];
			}
		}

		free(buf);
	}
	else if (M < N) {
		p = N - M;
		buf = (double*)malloc(sizeof(double)* p * M);

		for (i = 0; i < M; ++i) {
			iter = M + i*N;
			for (j = 0; j < p; ++j) {
				buf[j*M + i] = A[iter + j];
			}
		}

		for (i = 1; i < M; ++i) {
			memmove(A + i*M, A + i * N, sizeof(*A)*M);
		}

		for (i = 0; i < M; ++i) {
			for (j = i + 1; j < M; ++j) {
				temp = A[i + j*M];
				A[i + j*M] = A[j + i*M];
				A[j + i*M] = temp;
			}
		}
		memcpy(A + M*M, buf, sizeof(*A)*p*M);
		free(buf);
	}
}